

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O1

void proto2_unittest::TestHugeFieldNumbersLite::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  MessageLite *pMVar5;
  MessageLite *to_msg_00;
  void *pvVar6;
  _func_int **pp_Var7;
  Nonnull<const_char_*> pcVar8;
  Arena *pAVar9;
  string *value;
  Arena *arena;
  
  arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  if (from_msg == to_msg) {
    pcVar8 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                       (from_msg,to_msg,"&from != _this");
  }
  else {
    pcVar8 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar8 != (Nonnull<const_char_*>)0x0) goto LAB_001c8007;
  google::protobuf::RepeatedField<int>::MergeFrom
            ((RepeatedField<int> *)(to_msg + 3),(RepeatedField<int> *)(from_msg + 3));
  google::protobuf::RepeatedField<int>::MergeFrom
            ((RepeatedField<int> *)(to_msg + 4),(RepeatedField<int> *)(from_msg + 4));
  google::protobuf::internal::MapMergeFrom<std::__cxx11::string,std::__cxx11::string>
            ((Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&to_msg[5]._internal_metadata_,
             (Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&from_msg[5]._internal_metadata_);
  uVar1 = (uint)from_msg[2]._internal_metadata_.ptr_;
  if ((uVar1 & 0x7f) != 0) {
    if ((uVar1 & 1) != 0) {
      uVar4 = from_msg[7]._internal_metadata_.ptr_;
      *(uint *)&to_msg[2]._internal_metadata_.ptr_ = (uint)to_msg[2]._internal_metadata_.ptr_ | 1;
      pAVar9 = (Arena *)(to_msg->_internal_metadata_).ptr_;
      if (((ulong)pAVar9 & 1) != 0) {
        pAVar9 = *(Arena **)((ulong)pAVar9 & 0xfffffffffffffffe);
      }
      google::protobuf::internal::ArenaStringPtr::Set<>
                ((ArenaStringPtr *)&to_msg[7]._internal_metadata_,
                 (string *)(uVar4 & 0xfffffffffffffffc),pAVar9);
    }
    if ((uVar1 & 2) != 0) {
      pp_Var7 = from_msg[8]._vptr_MessageLite;
      *(uint *)&to_msg[2]._internal_metadata_.ptr_ = (uint)to_msg[2]._internal_metadata_.ptr_ | 2;
      pAVar9 = (Arena *)(to_msg->_internal_metadata_).ptr_;
      if (((ulong)pAVar9 & 1) != 0) {
        pAVar9 = *(Arena **)((ulong)pAVar9 & 0xfffffffffffffffe);
      }
      google::protobuf::internal::ArenaStringPtr::Set<>
                ((ArenaStringPtr *)(to_msg + 8),(string *)((ulong)pp_Var7 & 0xfffffffffffffffc),
                 pAVar9);
    }
    if ((uVar1 & 4) != 0) {
      pMVar5 = (MessageLite *)from_msg[8]._internal_metadata_.ptr_;
      if (pMVar5 != (MessageLite *)0x0) {
        to_msg_00 = (MessageLite *)to_msg[8]._internal_metadata_.ptr_;
        if (to_msg_00 == (MessageLite *)0x0) {
          pvVar6 = google::protobuf::Arena::CopyConstruct<proto2_unittest::ForeignMessageLite>
                             (arena,pMVar5);
          to_msg[8]._internal_metadata_.ptr_ = (intptr_t)pvVar6;
        }
        else {
          ForeignMessageLite::MergeImpl(to_msg_00,pMVar5);
        }
        goto LAB_001c7e03;
      }
      MergeImpl((TestHugeFieldNumbersLite *)&stack0xffffffffffffffc8);
LAB_001c7fff:
      MergeImpl((TestHugeFieldNumbersLite *)&stack0xffffffffffffffc8);
LAB_001c8007:
      MergeImpl();
    }
LAB_001c7e03:
    if ((uVar1 & 8) != 0) {
      pMVar5 = (MessageLite *)from_msg[9]._vptr_MessageLite;
      if (pMVar5 == (MessageLite *)0x0) goto LAB_001c7fff;
      if ((MessageLite *)to_msg[9]._vptr_MessageLite == (MessageLite *)0x0) {
        pp_Var7 = (_func_int **)
                  google::protobuf::Arena::
                  CopyConstruct<proto2_unittest::TestHugeFieldNumbersLite_OptionalGroup>
                            (arena,pMVar5);
        to_msg[9]._vptr_MessageLite = pp_Var7;
      }
      else {
        TestHugeFieldNumbersLite_OptionalGroup::MergeImpl
                  ((MessageLite *)to_msg[9]._vptr_MessageLite,pMVar5);
      }
    }
    if ((uVar1 & 0x10) != 0) {
      *(int *)&to_msg[9]._internal_metadata_.ptr_ = (int)from_msg[9]._internal_metadata_.ptr_;
    }
    if ((uVar1 & 0x20) != 0) {
      *(undefined4 *)((long)&to_msg[9]._internal_metadata_.ptr_ + 4) =
           *(undefined4 *)((long)&from_msg[9]._internal_metadata_.ptr_ + 4);
    }
    if ((uVar1 & 0x40) != 0) {
      *(undefined4 *)&to_msg[10]._vptr_MessageLite = *(undefined4 *)&from_msg[10]._vptr_MessageLite;
    }
  }
  *(uint *)&to_msg[2]._internal_metadata_.ptr_ = (uint)to_msg[2]._internal_metadata_.ptr_ | uVar1;
  iVar2 = *(int *)&from_msg[0xb]._vptr_MessageLite;
  if (iVar2 == 0) goto switchD_001c7ec4_default;
  iVar3 = *(int *)&to_msg[0xb]._vptr_MessageLite;
  if (iVar3 != iVar2) {
    if (iVar3 != 0) {
      clear_oneof_field((TestHugeFieldNumbersLite *)to_msg);
    }
    *(int *)&to_msg[0xb]._vptr_MessageLite = iVar2;
  }
  switch(iVar2) {
  case 0x1ffffc7b:
    *(int *)&to_msg[10]._internal_metadata_.ptr_ = (int)from_msg[10]._internal_metadata_.ptr_;
    break;
  case 0x1ffffc7c:
    if (iVar3 == iVar2) {
      TestAllTypesLite::MergeImpl
                ((MessageLite *)to_msg[10]._internal_metadata_.ptr_,
                 (MessageLite *)from_msg[10]._internal_metadata_.ptr_);
    }
    else {
      pvVar6 = google::protobuf::Arena::CopyConstruct<proto2_unittest::TestAllTypesLite>
                         (arena,(void *)from_msg[10]._internal_metadata_.ptr_);
      to_msg[10]._internal_metadata_.ptr_ = (intptr_t)pvVar6;
    }
    break;
  case 0x1ffffc7d:
    if (iVar3 != iVar2) {
      to_msg[10]._internal_metadata_.ptr_ =
           (intptr_t)&google::protobuf::internal::fixed_address_empty_string;
    }
    if (*(int *)&from_msg[0xb]._vptr_MessageLite == 0x1ffffc7d) goto LAB_001c7f2c;
LAB_001c7efc:
    value = (string *)&google::protobuf::internal::fixed_address_empty_string;
    goto LAB_001c7f37;
  case 0x1ffffc7e:
    if (iVar3 != iVar2) {
      to_msg[10]._internal_metadata_.ptr_ =
           (intptr_t)&google::protobuf::internal::fixed_address_empty_string;
    }
    if (*(int *)&from_msg[0xb]._vptr_MessageLite != 0x1ffffc7e) goto LAB_001c7efc;
LAB_001c7f2c:
    value = (string *)(from_msg[10]._internal_metadata_.ptr_ & 0xfffffffffffffffc);
LAB_001c7f37:
    google::protobuf::internal::ArenaStringPtr::Set<>
              ((ArenaStringPtr *)&to_msg[10]._internal_metadata_,value,arena);
  }
switchD_001c7ec4_default:
  google::protobuf::internal::ExtensionSet::MergeFrom
            ((ExtensionSet *)(to_msg + 1),(MessageLite *)_TestHugeFieldNumbersLite_default_instance_
             ,(ExtensionSet *)(from_msg + 1));
  uVar4 = (from_msg->_internal_metadata_).ptr_;
  if ((uVar4 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&to_msg->_internal_metadata_,(string *)((uVar4 & 0xfffffffffffffffe) + 8));
    return;
  }
  return;
}

Assistant:

void TestHugeFieldNumbersLite::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestHugeFieldNumbersLite*>(&to_msg);
  auto& from = static_cast<const TestHugeFieldNumbersLite&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.TestHugeFieldNumbersLite)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_repeated_int32()->MergeFrom(from._internal_repeated_int32());
  _this->_internal_mutable_packed_int32()->MergeFrom(from._internal_packed_int32());
  _this->_impl_.string_string_map_.MergeFrom(from._impl_.string_string_map_);
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000007fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_optional_string(from._internal_optional_string());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_internal_set_optional_bytes(from._internal_optional_bytes());
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      ABSL_DCHECK(from._impl_.optional_message_ != nullptr);
      if (_this->_impl_.optional_message_ == nullptr) {
        _this->_impl_.optional_message_ = ::google::protobuf::MessageLite::CopyConstruct(arena, *from._impl_.optional_message_);
      } else {
        _this->_impl_.optional_message_->MergeFrom(*from._impl_.optional_message_);
      }
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      ABSL_DCHECK(from._impl_.optionalgroup_ != nullptr);
      if (_this->_impl_.optionalgroup_ == nullptr) {
        _this->_impl_.optionalgroup_ = ::google::protobuf::MessageLite::CopyConstruct(arena, *from._impl_.optionalgroup_);
      } else {
        _this->_impl_.optionalgroup_->MergeFrom(*from._impl_.optionalgroup_);
      }
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      _this->_impl_.optional_int32_ = from._impl_.optional_int32_;
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      _this->_impl_.fixed_32_ = from._impl_.fixed_32_;
    }
    if ((cached_has_bits & 0x00000040u) != 0) {
      _this->_impl_.optional_enum_ = from._impl_.optional_enum_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  if (const uint32_t oneof_from_case = from._impl_._oneof_case_[0]) {
    const uint32_t oneof_to_case = _this->_impl_._oneof_case_[0];
    const bool oneof_needs_init = oneof_to_case != oneof_from_case;
    if (oneof_needs_init) {
      if (oneof_to_case != 0) {
        _this->clear_oneof_field();
      }
      _this->_impl_._oneof_case_[0] = oneof_from_case;
    }

    switch (oneof_from_case) {
      case kOneofUint32: {
        _this->_impl_.oneof_field_.oneof_uint32_ = from._impl_.oneof_field_.oneof_uint32_;
        break;
      }
      case kOneofTestAllTypes: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_test_all_types_ = ::google::protobuf::MessageLite::CopyConstruct(arena, *from._impl_.oneof_field_.oneof_test_all_types_);
        } else {
          _this->_impl_.oneof_field_.oneof_test_all_types_->MergeFrom(*from._impl_.oneof_field_.oneof_test_all_types_);
        }
        break;
      }
      case kOneofString: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_string_.InitDefault();
        }
        _this->_impl_.oneof_field_.oneof_string_.Set(from._internal_oneof_string(), arena);
        break;
      }
      case kOneofBytes: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_bytes_.InitDefault();
        }
        _this->_impl_.oneof_field_.oneof_bytes_.Set(from._internal_oneof_bytes(), arena);
        break;
      }
      case ONEOF_FIELD_NOT_SET:
        break;
    }
  }
  _this->_impl_._extensions_.MergeFrom(&default_instance(), from._impl_._extensions_);
  _this->_internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}